

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::key(Forth *this)

{
  Cell local_14;
  SCell ch;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"KEY");
  local_14 = 0xffffffff;
  if (this->readFromSource == FromString) {
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
    local_14 = std::istream::get();
  }
  else if (this->readFromSource == FromStdCin) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1924d0);
    local_14 = std::istream::get();
  }
  push(this,local_14);
  return;
}

Assistant:

void key() {
				REQUIRE_DSTACK_AVAILABLE(1, "KEY");
				SCell ch = EOF;
				switch (readFromSource) {
				case FromString:
					std_cin.clear();
					ch = static_cast<SCell>(std_cin.get());
					break;
				case FromStdCin:
					std::cin.clear();
					ch = static_cast<SCell>(std::cin.get());
					break;
				default:
					break;
			}
			push(ch);
		}